

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  undefined1 auStack_58 [4];
  int result_is_zero;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  size_t j;
  size_t i;
  mbedtls_mpi *pmStack_20;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&TB.s);
  mbedtls_mpi_init((mbedtls_mpi *)auStack_58);
  B_local = A;
  if (X == A) {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&TB.s,A);
    if (i._4_4_ != 0) goto LAB_0036817e;
    B_local = (mbedtls_mpi *)&TB.s;
  }
  pmStack_20 = B;
  if (X == B) {
    i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)auStack_58,B);
    if (i._4_4_ != 0) goto LAB_0036817e;
    pmStack_20 = (mbedtls_mpi *)auStack_58;
  }
  for (j = (size_t)B_local->n; (j != 0 && (B_local->p[j - 1] == 0)); j = j - 1) {
  }
  for (TA._8_8_ = ZEXT28(pmStack_20->n); (TA._8_8_ != 0 && (pmStack_20->p[TA._8_8_ + -1] == 0));
      TA._8_8_ = TA._8_8_ + -1) {
  }
  i._4_4_ = mbedtls_mpi_grow(X,j + TA._8_8_);
  if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_lset(X,0), i._4_4_ == 0)) {
    mbedtls_mpi_core_mul(X->p,B_local->p,j,pmStack_20->p,TA._8_8_);
    if (TA._8_8_ == 0 || j == 0) {
      X->s = 1;
    }
    else {
      X->s = B_local->s * pmStack_20->s;
    }
  }
LAB_0036817e:
  mbedtls_mpi_free((mbedtls_mpi *)auStack_58);
  mbedtls_mpi_free((mbedtls_mpi *)&TB.s);
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    int result_is_zero = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    mbedtls_mpi_init(&TA);
    mbedtls_mpi_init(&TB);

    if (X == A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A)); A = &TA;
    }
    if (X == B) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B)); B = &TB;
    }

    for (i = A->n; i > 0; i--) {
        if (A->p[i - 1] != 0) {
            break;
        }
    }
    if (i == 0) {
        result_is_zero = 1;
    }

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }
    if (j == 0) {
        result_is_zero = 1;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i + j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

    mbedtls_mpi_core_mul(X->p, A->p, i, B->p, j);

    /* If the result is 0, we don't shortcut the operation, which reduces
     * but does not eliminate side channels leaking the zero-ness. We do
     * need to take care to set the sign bit properly since the library does
     * not fully support an MPI object with a value of 0 and s == -1. */
    if (result_is_zero) {
        X->s = 1;
    } else {
        X->s = A->s * B->s;
    }

cleanup:

    mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TA);

    return ret;
}